

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

void __thiscall
PacketBuilder::PacketBuilder
          (PacketBuilder *this,PacketFamily family,PacketAction action,size_t size_guess)

{
  size_t size_guess_local;
  PacketAction action_local;
  PacketFamily family_local;
  PacketBuilder *this_local;
  
  std::__cxx11::string::string((string *)&this->data);
  this->add_size = 0;
  SetID(this,family,action);
  std::__cxx11::string::reserve((ulong)&this->data);
  return;
}

Assistant:

PacketBuilder::PacketBuilder(PacketFamily family, PacketAction action, std::size_t size_guess)
	: add_size(0)
{
	this->SetID(family, action);

	this->data.reserve(size_guess);
}